

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

int spacingHelper(QWidget *parent,QStyle *style,int userVSpacing,bool recalculate,
                 QFormLayoutItem *item1,QFormLayoutItem *item2,QFormLayoutItem *prevItem1,
                 QFormLayoutItem *prevItem2)

{
  ControlTypes CVar1;
  int iVar2;
  int *piVar3;
  QWidget *pQVar4;
  byte in_CL;
  int in_EDX;
  QWidget *in_RSI;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  QWidget *wid_1;
  QWidget *wid;
  int spacing2;
  ControlTypes itemtypes;
  int spacing;
  undefined4 in_stack_ffffffffffffff48;
  ControlType in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QStyleOption *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  Orientation orientation;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_48;
  QRect local_44;
  int local_34;
  QRect local_30;
  int local_20;
  Int local_1c;
  QFlagsStorage<QSizePolicy::ControlType> local_18;
  int local_14;
  QFlagsStorageHelper<QSizePolicy::ControlType,_4> local_10;
  int local_c;
  long local_8;
  
  orientation = (Orientation)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  if (in_EDX < 0) {
    if ((in_CL & 1) == 0) {
      if (in_R8 != 0) {
        local_c = *(int *)(in_R8 + 0x28);
      }
      if (in_R9 != 0) {
        piVar3 = qMax<int>(&local_c,(int *)(in_R9 + 0x28));
        local_c = *piVar3;
      }
    }
    else if ((in_RSI != (QWidget *)0x0) && (in_stack_00000008 != (undefined8 *)0x0)) {
      local_10.super_QFlagsStorage<QSizePolicy::ControlType>.i =
           (QFlagsStorage<QSizePolicy::ControlType>)0xaaaaaaaa;
      if (in_R8 == 0) {
        QFlags<QSizePolicy::ControlType>::QFlags
                  ((QFlags<QSizePolicy::ControlType> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c);
      }
      else {
        local_10.super_QFlagsStorage<QSizePolicy::ControlType>.i =
             (QFlagsStorage<QSizePolicy::ControlType>)
             QFormLayoutItem::controlTypes
                       ((QFormLayoutItem *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      local_14 = 0;
      local_18 = local_10.super_QFlagsStorage<QSizePolicy::ControlType>.i;
      QFormLayoutItem::controlTypes
                ((QFormLayoutItem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_c = QStyle::combinedLayoutSpacing
                          ((QStyle *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
                           SUB84((ulong)in_R8 >> 0x20,0),
                           (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)SUB84(in_R8,0),
                           orientation,in_stack_ffffffffffffff70,in_RSI);
      if (in_R9 == 0) {
        if (in_stack_00000010 != (undefined8 *)0x0) {
          local_1c = (Int)local_10.super_QFlagsStorage<QSizePolicy::ControlType>.i;
          CVar1 = QFormLayoutItem::controlTypes
                            ((QFormLayoutItem *)
                             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
          local_14 = QStyle::combinedLayoutSpacing
                               ((QStyle *)
                                CONCAT44(in_stack_ffffffffffffff84,
                                         CVar1.
                                         super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
                                         super_QFlagsStorage<QSizePolicy::ControlType>.i),
                                (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
                                SUB84((ulong)in_R8 >> 0x20,0),
                                (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)SUB84(in_R8,0),
                                orientation,in_stack_ffffffffffffff70,in_RSI);
        }
      }
      else {
        QFormLayoutItem::controlTypes
                  ((QFormLayoutItem *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48))
        ;
        CVar1 = QFormLayoutItem::controlTypes
                          ((QFormLayoutItem *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        local_14 = QStyle::combinedLayoutSpacing
                             ((QStyle *)
                              CONCAT44(CVar1.super_QFlagsStorageHelper<QSizePolicy::ControlType,_4>.
                                       super_QFlagsStorage<QSizePolicy::ControlType>.i,
                                       in_stack_ffffffffffffff80),
                              (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
                              SUB84((ulong)in_R8 >> 0x20,0),
                              (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)SUB84(in_R8,0),
                              orientation,in_stack_ffffffffffffff70,in_RSI);
      }
      piVar3 = qMax<int>(&local_c,&local_14);
      local_c = *piVar3;
    }
  }
  else {
    if ((in_stack_00000008 != (undefined8 *)0x0) &&
       (pQVar4 = (QWidget *)(**(code **)(*(long *)*in_stack_00000008 + 0x68))(),
       pQVar4 != (QWidget *)0x0)) {
      local_30 = QFormLayoutItem::geometry((QFormLayoutItem *)0x4b4d1a);
      iVar2 = QRect::top((QRect *)0x4b4d37);
      QWidget::geometry(pQVar4);
      local_20 = QRect::top((QRect *)0x4b4d4d);
      local_20 = iVar2 - local_20;
      piVar3 = qMax<int>(&local_c,&local_20);
      local_c = *piVar3;
    }
    if ((in_stack_00000010 != (undefined8 *)0x0) &&
       (pQVar4 = (QWidget *)(**(code **)(*(long *)*in_stack_00000010 + 0x68))(),
       pQVar4 != (QWidget *)0x0)) {
      local_44 = QFormLayoutItem::geometry((QFormLayoutItem *)0x4b4db6);
      iVar2 = QRect::top((QRect *)0x4b4dca);
      QWidget::geometry(pQVar4);
      local_34 = QRect::top((QRect *)0x4b4de0);
      local_34 = iVar2 - local_34;
      piVar3 = qMax<int>(&local_c,&local_34);
      local_c = *piVar3;
    }
  }
  local_48 = 0;
  piVar3 = qMax<int>(&local_c,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *piVar3;
}

Assistant:

static inline int spacingHelper(QWidget* parent, QStyle *style, int userVSpacing, bool recalculate, QFormLayoutItem* item1, QFormLayoutItem* item2, QFormLayoutItem* prevItem1, QFormLayoutItem *prevItem2)
{
    int spacing = userVSpacing;
    if (spacing < 0) {
        if (!recalculate) {
            if (item1)
                spacing = item1->vSpace;
            if (item2)
                spacing = qMax(spacing, item2->vSpace);
        } else {
            if (style && prevItem1) {
                QSizePolicy::ControlTypes itemtypes =
                    QSizePolicy::ControlTypes(item1 ? item1->controlTypes() : QSizePolicy::DefaultType);
                int spacing2 = 0;

                spacing = style->combinedLayoutSpacing(itemtypes, prevItem1->controlTypes(), Qt::Vertical, nullptr, parent);

                // At most of one of item2 and prevItem2 will be nonnull
                if (item2)
                    spacing2 = style->combinedLayoutSpacing(item2->controlTypes(), prevItem1->controlTypes(), Qt::Vertical, nullptr, parent);
                else if (prevItem2)
                    spacing2 = style->combinedLayoutSpacing(itemtypes, prevItem2->controlTypes(), Qt::Vertical, nullptr, parent);

                spacing = qMax(spacing, spacing2);
            }
        }
    } else {
        if (prevItem1) {
            QWidget *wid = prevItem1->item->widget();
            if (wid)
                spacing = qMax(spacing, prevItem1->geometry().top() - wid->geometry().top() );
        }
        if (prevItem2) {
            QWidget *wid = prevItem2->item->widget();
            if (wid)
                spacing = qMax(spacing, prevItem2->geometry().top() - wid->geometry().top() );
        }
    }
    return qMax(spacing, 0);
}